

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralComparators.hpp
# Opt level: O1

Comparison __thiscall
Kernel::LiteralComparators::LexComparator::compare(LexComparator *this,Literal *l1,Literal *l2)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  Comparison CVar6;
  SubtermIterator sit2;
  SubtermIterator sit1;
  SubtermIterator local_70;
  SubtermIterator local_48;
  
  uVar4 = ((uint)(l1->super_Term)._args[0]._content >> 2 & 1) + (l1->super_Term)._functor * 2;
  uVar5 = ((uint)(l2->super_Term)._args[0]._content >> 2 & 1) + (l2->super_Term)._functor * 2;
  if (uVar4 == uVar5) {
    SubtermIterator::SubtermIterator(&local_48,&l1->super_Term);
    SubtermIterator::SubtermIterator(&local_70,&l2->super_Term);
    do {
      bVar3 = SubtermIterator::hasNext(&local_48);
      if (!bVar3) {
        CVar6 = EQUAL;
        break;
      }
      SubtermIterator::hasNext(&local_70);
      local_48._used = true;
      uVar1 = (*(TermList ***)
                ((long)local_48._stack._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>.
                       _M_head_impl + 0x10))[-1]->_content;
      local_70._used = true;
      uVar2 = (*(TermList ***)
                ((long)local_70._stack._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>.
                       _M_head_impl + 0x10))[-1]->_content;
      if ((uVar1 & 3) == 0) {
        if ((uVar2 & 3) != 0) {
          l2 = (Literal *)0x1;
          goto LAB_0055c641;
        }
        bVar3 = *(uint *)(uVar1 + 8) == *(uint *)(uVar2 + 8);
        l2 = (Literal *)((ulong)l2 & 0xffffffff);
        if (!bVar3) {
          l2 = (Literal *)(ulong)(-(uint)(*(uint *)(uVar1 + 8) < *(uint *)(uVar2 + 8)) | 1);
        }
      }
      else if ((uVar2 & 3) == 0) {
        l2 = (Literal *)0xffffffff;
LAB_0055c641:
        bVar3 = false;
      }
      else {
        bVar3 = true;
        uVar4 = (uint)(uVar1 >> 2);
        uVar5 = (uint)(uVar2 >> 2);
        if (uVar4 != uVar5) {
          bVar3 = false;
          l2 = (Literal *)(ulong)(-(uint)(uVar4 < uVar5) | 1);
        }
      }
      CVar6 = (Comparison)l2;
    } while (bVar3);
    local_70.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
         (_func_int **)&PTR__SubtermIterator_00b69868;
    ::Lib::
    Recycled<Lib::Stack<const_Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled(&local_70._stack);
    local_48.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
         (_func_int **)&PTR__SubtermIterator_00b69868;
    ::Lib::
    Recycled<Lib::Stack<const_Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled(&local_48._stack);
  }
  else {
    CVar6 = -(uint)(uVar4 < uVar5) | GREATER;
  }
  return CVar6;
}

Assistant:

Comparison compare(Literal* l1, Literal* l2)
  {
    ASS(l1->shared());
    ASS(l2->shared());

    if(l1->header()!=l2->header()) {
      return Int::compare(l1->header(),l2->header());
    }

    SubtermIterator sit1(l1);
    SubtermIterator sit2(l2);
    while(sit1.hasNext()) {
      ALWAYS(sit2.hasNext());
      TermList st1=sit1.next();
      TermList st2=sit2.next();
      if(st1.isTerm()) {
	if(st2.isTerm()) {
	  unsigned f1=st1.term()->functor();
	  unsigned f2=st2.term()->functor();
	  if(f1!=f2) {
	    return Int::compare(f1,f2);
	  }
	} else {
	  return GREATER;
	}
      } else {
	if(st2.isTerm()) {
	  return LESS;
	} else {
	  if(st1.var()!=st2.var()) {
	    return Int::compare(st1.var(),st2.var());
	  }
	}
      }
    }
    ASS(l1==l2);
    return EQUAL;
  }